

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom_parser.c
# Opt level: O0

int image_oprom_get_version(igsc_oprom_image *img,igsc_oprom_type type,igsc_oprom_version *version)

{
  igsc_oprom_type iVar1;
  igsc_oprom_type img_type;
  igsc_oprom_version *version_local;
  igsc_oprom_type type_local;
  igsc_oprom_image *img_local;
  
  iVar1 = image_oprom_get_type(img);
  if (iVar1 == IGSC_OPROM_NONE) {
    img_local._4_4_ = 5;
  }
  else if ((iVar1 & type) == IGSC_OPROM_NONE) {
    img_local._4_4_ = 9;
  }
  else if (type == IGSC_OPROM_DATA) {
    gsc_memcpy_s(version,8,&img->data_version,8);
    img_local._4_4_ = 0;
  }
  else if (type == IGSC_OPROM_CODE) {
    gsc_memcpy_s(version,8,&img->code_version,8);
    img_local._4_4_ = 0;
  }
  else {
    img_local._4_4_ = 3;
  }
  return img_local._4_4_;
}

Assistant:

int image_oprom_get_version(struct igsc_oprom_image *img,
                            enum igsc_oprom_type type,
                            struct igsc_oprom_version *version)
{
    enum igsc_oprom_type img_type;

    img_type = image_oprom_get_type(img);
    if (img_type == IGSC_OPROM_NONE)
    {
        return IGSC_ERROR_BAD_IMAGE;
    }

    if ((img_type & type) == 0)
    {
        return IGSC_ERROR_NOT_SUPPORTED;
    }

    if (type == IGSC_OPROM_DATA)
    {
        gsc_memcpy_s(version, sizeof(*version),
                     &img->data_version,  sizeof(*version));
        return IGSC_SUCCESS;
    }
    else if (type == IGSC_OPROM_CODE)
    {
        gsc_memcpy_s(version, sizeof(*version),
                     &img->code_version,  sizeof(*version));
        return IGSC_SUCCESS;
    }

    return IGSC_ERROR_INVALID_PARAMETER;
}